

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O1

NoSelfMove * __thiscall
bssl::anon_unknown_0::InplaceVectorTest_EraseIf_Test::TestBody::NoSelfMove::operator=
          (NoSelfMove *this,NoSelfMove *other)

{
  _Head_base<0UL,_int_*,_false> _Var1;
  _Head_base<0UL,_int_*,_false> _Var2;
  
  if (this != other) {
    _Var1._M_head_impl =
         (other->v_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (other->v_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (int *)0x0;
    _Var2._M_head_impl =
         (this->v_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    (this->v_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = _Var1._M_head_impl;
    if (_Var2._M_head_impl != (int *)0x0) {
      operator_delete(_Var2._M_head_impl,4);
    }
    return this;
  }
  abort();
}

Assistant:

NoSelfMove &operator=(NoSelfMove &&other) {
      BSSL_CHECK(this != &other);
      v_ = std::move(other.v_);
      return *this;
    }